

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csm::ModelIdentifier::componentNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ModelIdentifier *this)

{
  _Rb_tree_node_base *p_Var1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var1 = (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->theComponents)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)(p_Var1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ModelIdentifier::componentNames() const
{
   std::vector<std::string> names;
   names.reserve(theComponents.size());
   
   MIComponentMap::const_iterator END = theComponents.end();
   
   for (MIComponentMap::const_iterator iter = theComponents.begin();
        iter != END; ++iter)
   {
      names.push_back(iter->first);
   }
   
   return names;
}